

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall
Bstrlib::CBString::findreplacecaseless(CBString *this,char *sfind,char *repl,int pos)

{
  int iVar1;
  CBStringException *pCVar2;
  size_t sVar3;
  undefined4 local_118;
  undefined4 local_114;
  allocator local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  CBStringException bstr__cppwrapper_exception;
  tagbstring u;
  tagbstring t;
  int pos_local;
  char *repl_local;
  char *sfind_local;
  CBString *this_local;
  
  if ((repl == (char *)0x0) || (sfind == (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"CBString::findreplacecaseless NULL.",&local_91);
    CBStringException::CBStringException((CBStringException *)local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_70);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (sfind == (char *)0x0) {
    local_114 = 0;
  }
  else {
    sVar3 = strlen(sfind);
    local_114 = (undefined4)sVar3;
  }
  u.data._4_4_ = local_114;
  u.data._0_4_ = 0xffffffff;
  u._0_8_ = repl;
  if (repl == (char *)0x0) {
    local_118 = 0;
  }
  else {
    sVar3 = strlen(repl);
    local_118 = (undefined4)sVar3;
  }
  bstr__cppwrapper_exception.msg.field_2._12_4_ = local_118;
  bstr__cppwrapper_exception.msg.field_2._8_4_ = 0xffffffff;
  iVar1 = bfindreplacecaseless
                    (&this->super_tagbstring,(const_bstring)&u.data,
                     (const_bstring)((long)&bstr__cppwrapper_exception.msg.field_2 + 8),pos);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f0,"CBString::Failure in findreplacecaseless",&local_f1);
    CBStringException::CBStringException((CBStringException *)local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_d0);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::findreplacecaseless (const char * sfind, const char * repl, int pos) {
struct tagbstring t, u;
	if (NULL == repl || NULL == sfind) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("findreplacecaseless NULL.");
#else
		return;
#endif
	}
	cstr2tbstr (t, sfind);
	cstr2tbstr (u, repl);
	if (BSTR_ERR == bfindreplacecaseless (this, (bstring) &t, (bstring) &u, pos)) {
		bstringThrow ("Failure in findreplacecaseless");
	}
}